

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_matrix.cpp
# Opt level: O0

string * __thiscall
ExtendedMatrix::ToLaTex_abi_cxx11_(string *__return_storage_ptr__,ExtendedMatrix *this)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  Fraction *pFVar4;
  string local_1f0;
  int local_1cc;
  undefined1 local_1c8 [4];
  int column_1;
  int local_1a4;
  int local_1a0;
  int column;
  int row;
  ostringstream local_190 [8];
  ostringstream out;
  ExtendedMatrix *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar3 = std::operator<<((ostream *)local_190,"\\begin{bmatrix}");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_1a0 = 0;
  while( true ) {
    iVar2 = local_1a0;
    iVar1 = GetNumRows(this);
    if (iVar1 <= iVar2) break;
    local_1a4 = 0;
    while( true ) {
      iVar2 = local_1a4;
      iVar1 = Matrix::GetNumColumns(&this->main_);
      if (iVar1 <= iVar2) break;
      pFVar4 = Matrix::At(&this->main_,local_1a0,local_1a4);
      Fraction::ToLaTex_abi_cxx11_((string *)local_1c8,pFVar4);
      poVar3 = std::operator<<((ostream *)local_190,(string *)local_1c8);
      std::operator<<(poVar3," & ");
      std::__cxx11::string::~string((string *)local_1c8);
      local_1a4 = local_1a4 + 1;
    }
    std::operator<<((ostream *)local_190,"\\vline & ");
    local_1cc = 0;
    while( true ) {
      iVar2 = local_1cc;
      iVar1 = Matrix::GetNumColumns(&this->extension_);
      if (iVar1 <= iVar2) break;
      pFVar4 = Matrix::At(&this->extension_,local_1a0,local_1cc);
      Fraction::ToLaTex_abi_cxx11_(&local_1f0,pFVar4);
      std::operator<<((ostream *)local_190,(string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      iVar2 = local_1cc + 1;
      iVar1 = Matrix::GetNumColumns(&this->extension_);
      if (iVar2 != iVar1) {
        std::operator<<((ostream *)local_190," & ");
      }
      local_1cc = local_1cc + 1;
    }
    iVar2 = local_1a0 + 1;
    iVar1 = GetNumRows(this);
    if (iVar2 != iVar1) {
      std::operator<<((ostream *)local_190,"\\\\");
    }
    std::ostream::operator<<(local_190,std::endl<char,std::char_traits<char>>);
    local_1a0 = local_1a0 + 1;
  }
  std::operator<<((ostream *)local_190,"\\end{bmatrix}");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string ExtendedMatrix::ToLaTex() const {
  std::ostringstream out;
  out << "\\begin{bmatrix}" << std::endl;
  for (int row = 0; row < GetNumRows(); ++row) {
    for (int column = 0; column < main_.GetNumColumns(); ++column) {
      out << main_.At(row, column).ToLaTex() << " & ";
    }
    out << "\\vline & ";
    for (int column = 0; column < extension_.GetNumColumns(); ++column) {
      out << extension_.At(row, column).ToLaTex();
      if (column + 1 != extension_.GetNumColumns()) {
        out << " & ";
      }
    }
    if (row + 1 != GetNumRows()) {
      out << "\\\\";
    }
    out << std::endl;
  }
  out << "\\end{bmatrix}";

  return out.str();
}